

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double insphere(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dStack_30;
  
  dVar18 = *pe;
  dVar17 = pe[1];
  dVar14 = *pd - dVar18;
  dVar15 = pc[1] - dVar17;
  dVar8 = pd[1] - dVar17;
  dVar9 = *pc - dVar18;
  dVar6 = pe[2];
  dVar2 = pa[2] - dVar6;
  dVar3 = *pb - dVar18;
  dVar4 = pc[2] - dVar6;
  dVar5 = pb[2] - dVar6;
  dVar18 = *pa - dVar18;
  dVar21 = pa[1] - dVar17;
  dVar16 = dVar15 * dVar18 - dVar9 * dVar21;
  dVar17 = pb[1] - dVar17;
  dVar10 = dVar17 * dVar18 - dVar3 * dVar21;
  dVar6 = pd[2] - dVar6;
  dVar7 = dVar8 * dVar9 - dVar15 * dVar14;
  dVar12 = dVar8 * dVar3 - dVar17 * dVar14;
  dVar19 = dVar21 * dVar14 - dVar18 * dVar8;
  dVar22 = dVar3 * dVar15 - dVar17 * dVar9;
  dVar11 = dVar5 * dVar5 + dVar3 * dVar3 + dVar17 * dVar17;
  dVar20 = dVar4 * dVar4 + dVar9 * dVar9 + dVar15 * dVar15;
  dVar23 = dVar2 * dVar2 + dVar18 * dVar18 + dVar21 * dVar21;
  dVar13 = dVar6 * dVar6 + dVar14 * dVar14 + dVar8 * dVar8;
  dVar7 = (dVar11 * (dVar2 * dVar7 + dVar19 * dVar4 + dVar6 * dVar16) -
          (dVar6 * dVar22 + dVar7 * dVar5 + -dVar4 * dVar12) * dVar23) +
          ((dVar10 * dVar4 + dVar22 * dVar2 + -dVar5 * dVar16) * dVar13 -
          (dVar5 * dVar19 + dVar10 * dVar6 + dVar2 * dVar12) * dVar20);
  if ((_use_inexact_arith == 0) && ((_use_static_filter == 0 || (ABS(dVar7) <= ispstaticfilter)))) {
    dVar2 = ABS(dVar2);
    dVar5 = ABS(dVar5);
    dVar4 = ABS(dVar4);
    dVar6 = ABS(dVar6);
    dVar10 = ABS(dVar17 * dVar18);
    dVar12 = ABS(dVar3 * dVar21);
    auVar1._8_4_ = SUB84(dVar12,0);
    auVar1._0_8_ = dVar10;
    auVar1._12_4_ = (int)((ulong)dVar12 >> 0x20);
    dVar12 = ABS(dVar8 * dVar9) + ABS(dVar15 * dVar14);
    dVar16 = ABS(dVar17 * dVar14) + ABS(dVar8 * dVar3);
    dVar17 = ABS(dVar3 * dVar15) + ABS(dVar17 * dVar9);
    dVar3 = ABS(dVar18 * dVar8) + ABS(dVar21 * dVar14);
    dVar18 = ABS(dVar9 * dVar21) + ABS(dVar15 * dVar18);
    dStack_30 = auVar1._8_8_;
    dStack_30 = dStack_30 + dVar10;
    dVar6 = (dStack_30 * dVar4 + dVar17 * dVar2 + dVar18 * dVar5) * dVar13 +
            (dVar3 * dVar5 + dVar6 * dStack_30 + dVar16 * dVar2) * dVar20 +
            dVar23 * (dVar17 * dVar6 + dVar12 * dVar5 + dVar16 * dVar4) +
            dVar11 * (dVar12 * dVar2 + dVar3 * dVar4 + dVar18 * dVar6);
    dVar5 = isperrboundA * dVar6;
    if ((dVar7 <= dVar5) && (-dVar7 <= dVar5)) {
      dVar6 = insphereadapt(pa,pb,pc,pd,pe,dVar6);
      return dVar6;
    }
  }
  return dVar7;
}

Assistant:

REAL insphere(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
  REAL aexcey, cexaey, bexdey, dexbey;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;
  REAL det;


  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  aexbey = aex * bey;
  bexaey = bex * aey;
  ab = aexbey - bexaey;
  bexcey = bex * cey;
  cexbey = cex * bey;
  bc = bexcey - cexbey;
  cexdey = cex * dey;
  dexcey = dex * cey;
  cd = cexdey - dexcey;
  dexaey = dex * aey;
  aexdey = aex * dey;
  da = dexaey - aexdey;

  aexcey = aex * cey;
  cexaey = cex * aey;
  ac = aexcey - cexaey;
  bexdey = bex * dey;
  dexbey = dex * bey;
  bd = bexdey - dexbey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  det = (dlift * abc - clift * dab) + (blift * cda - alift * bcd);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    if (fabs(det) > ispstaticfilter) return det;
    //if (det > ispstaticfilter) return det;
    //if (det < minus_ispstaticfilter) return det;

  }

  REAL aezplus, bezplus, cezplus, dezplus;
  REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
  REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
  REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
  REAL permanent, errbound;

  aezplus = Absolute(aez);
  bezplus = Absolute(bez);
  cezplus = Absolute(cez);
  dezplus = Absolute(dez);
  aexbeyplus = Absolute(aexbey);
  bexaeyplus = Absolute(bexaey);
  bexceyplus = Absolute(bexcey);
  cexbeyplus = Absolute(cexbey);
  cexdeyplus = Absolute(cexdey);
  dexceyplus = Absolute(dexcey);
  dexaeyplus = Absolute(dexaey);
  aexdeyplus = Absolute(aexdey);
  aexceyplus = Absolute(aexcey);
  cexaeyplus = Absolute(cexaey);
  bexdeyplus = Absolute(bexdey);
  dexbeyplus = Absolute(dexbey);
  permanent = ((cexdeyplus + dexceyplus) * bezplus
               + (dexbeyplus + bexdeyplus) * cezplus
               + (bexceyplus + cexbeyplus) * dezplus)
            * alift
            + ((dexaeyplus + aexdeyplus) * cezplus
               + (aexceyplus + cexaeyplus) * dezplus
               + (cexdeyplus + dexceyplus) * aezplus)
            * blift
            + ((aexbeyplus + bexaeyplus) * dezplus
               + (bexdeyplus + dexbeyplus) * aezplus
               + (dexaeyplus + aexdeyplus) * bezplus)
            * clift
            + ((bexceyplus + cexbeyplus) * aezplus
               + (cexaeyplus + aexceyplus) * bezplus
               + (aexbeyplus + bexaeyplus) * cezplus)
            * dlift;
  errbound = isperrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return insphereadapt(pa, pb, pc, pd, pe, permanent);
}